

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::generateTextureBufferGenerationGroup
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                *group,GLenum target)

{
  string sStack_b8;
  code *local_98;
  GLenum local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [56];
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_68._4_4_ = 0x8518;
  if (target != 0x8513) {
    local_68._4_4_ = target;
  }
  local_30._M_p = (pointer)&local_20;
  local_68._20_4_ = 0x100;
  local_68[0x18] = false;
  local_68._32_8_ = (pointer)0x0;
  local_68._40_8_ = (pointer)0x0;
  local_68._48_8_ = (pointer)0x0;
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  local_68[8] = true;
  local_68[9] = true;
  local_68._12_4_ = 0;
  local_68._16_4_ = 0;
  local_98 = glu::getTextureTargetName;
  local_90 = target;
  local_68._0_4_ = target;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&sStack_b8,&local_98);
  std::operator+(&local_88,&sStack_b8,", initial values");
  std::__cxx11::string::operator=((string *)&local_30,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(group,(value_type *)local_68);
  TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)local_68);
  return;
}

Assistant:

static void generateTextureBufferGenerationGroup (std::vector<TextureGenerationSpec>& group, glw::GLenum target)
{
	const glw::GLenum queryTarget = (target == GL_TEXTURE_CUBE_MAP) ? (GL_TEXTURE_CUBE_MAP_NEGATIVE_Y) : (target);

	// initial
	{
		TextureGenerationSpec texGen;
		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= 0;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", initial values";

		group.push_back(texGen);
	}

	// actual specification tests are in texture_buffer tests, no need to do them here too
}